

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

string * __thiscall
Session::receive(Session *this,string *message_name,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  long in_RSI;
  string *in_RDI;
  Server *in_stack_fffffffffffffec8;
  StringInstance *in_stack_fffffffffffffed0;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  string *this_00;
  allocator local_f1;
  string local_f0 [88];
  string *in_stack_ffffffffffffff68;
  StringInstance *in_stack_ffffffffffffff70;
  string local_58 [55];
  allocator local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  if (bVar1) {
    *(undefined1 *)(in_RSI + 0x10) = 0;
    paVar5 = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"null",paVar5);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    if (!bVar1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "RuntimeError: invalid message.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (sVar3 != 1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "RuntimeError: wrong number of arguments.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,0);
    bVar1 = Grammar::is_string_value(in_stack_fffffffffffffee8);
    if (!bVar1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "RuntimeError: invalid argument.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,0);
    StringInstance::StringInstance(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    StringInstance::value_abi_cxx11_((StringInstance *)in_stack_fffffffffffffec8);
    Server::get_instance();
    Server::get_password_abi_cxx11_(in_stack_fffffffffffffec8);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_00,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_58);
    StringInstance::~StringInstance(in_stack_fffffffffffffed0);
    if (!_Var2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "AuthenticationError: wrong password.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    *(undefined1 *)(in_RSI + 0x11) = 1;
    paVar5 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"null",paVar5);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  return in_RDI;
}

Assistant:

std::string Session::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "close") {
        _is_connected = false;
        return "null";
    }
    if (message_name == "authenticateWithPassword:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_string_value(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        if (StringInstance(arguments[0]).value() == Server::get_instance()->get_password()) {
            _is_authenticated = true;
            return "null";
        }
        throw EXC_WRONG_PASSWORD;
    }
    throw EXC_INVALID_MESSAGE;
}